

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

void Aig_ManDfs_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vNodes_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  if (pObj != (Aig_Obj_t *)0x0) {
    iVar1 = Aig_IsComplement(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                    ,0x7b,"void Aig_ManDfs_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
    if (iVar1 == 0) {
      Aig_ObjSetTravIdCurrent(p,pObj);
      if ((p->pEquivs != (Aig_Obj_t **)0x0) &&
         (pAVar2 = Aig_ObjEquiv(p,pObj), pAVar2 != (Aig_Obj_t *)0x0)) {
        pAVar2 = Aig_ObjEquiv(p,pObj);
        Aig_ManDfs_rec(p,pAVar2,vNodes);
      }
      pAVar2 = Aig_ObjFanin0(pObj);
      Aig_ManDfs_rec(p,pAVar2,vNodes);
      pAVar2 = Aig_ObjFanin1(pObj);
      Aig_ManDfs_rec(p,pAVar2,vNodes);
      Vec_PtrPush(vNodes,pObj);
    }
  }
  return;
}

Assistant:

void Aig_ManDfs_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( pObj == NULL )
        return;
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( p->pEquivs && Aig_ObjEquiv(p, pObj) )
        Aig_ManDfs_rec( p, Aig_ObjEquiv(p, pObj), vNodes );
    Aig_ManDfs_rec( p, Aig_ObjFanin0(pObj), vNodes );
    Aig_ManDfs_rec( p, Aig_ObjFanin1(pObj), vNodes );
    Vec_PtrPush( vNodes, pObj );
}